

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchNewQbf.cpp
# Opt level: O1

void Bmatch_PrepareFinalOut(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtkQbf,int ILP_Constraint)

{
  long *plVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  Abc_Obj_t *pObjTmp;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> XorOuts;
  Abc_Obj_t *local_50;
  undefined8 *local_48;
  iterator iStack_40;
  Abc_Obj_t_ **local_38;
  
  local_48 = (undefined8 *)0x0;
  iStack_40._M_current = (Abc_Obj_t_ **)0x0;
  local_38 = (Abc_Obj_t_ **)0x0;
  pVVar2 = pNtk1->vPos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      plVar1 = (long *)pVVar2->pArray[lVar3];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Print Xor : ",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      Abc_AigPrintNode((Abc_Obj_t *)plVar1[8]);
      Abc_AigPrintNode((Abc_Obj_t *)
                       ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                       *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                           (long)*(int *)plVar1[4] * 8) + 0x40)));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"END.",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      local_50 = Abc_AigXor((Abc_Aig_t *)pNtkQbf->pManFunc,(Abc_Obj_t *)plVar1[8],
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                            *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                                (long)*(int *)plVar1[4] * 8) + 0x40)));
      if (iStack_40._M_current == local_38) {
        std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::_M_realloc_insert<Abc_Obj_t_*const&>
                  ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&local_48,iStack_40,&local_50)
        ;
      }
      else {
        *iStack_40._M_current = local_50;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk1->vPos;
    } while (lVar3 < pVVar2->nSize);
  }
  local_50 = (Abc_Obj_t *)*local_48;
  uVar4 = (uint)((ulong)((long)iStack_40._M_current - (long)local_48) >> 3);
  if (1 < (int)uVar4) {
    uVar5 = 1;
    do {
      local_50 = Abc_AigOr((Abc_Aig_t *)pNtkQbf->pManFunc,local_50,(Abc_Obj_t *)local_48[uVar5]);
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  pObj = Abc_NtkCreateObj(pNtkQbf,ABC_OBJ_PO);
  Abc_ObjAssignName(pObj,"MainOut",(char *)0x0);
  Abc_ObjAddFanin(pObj,(Abc_Obj_t *)((ulong)local_50 ^ 1));
  Abc_AigCleanup((Abc_Aig_t *)pNtkQbf->pManFunc);
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void Bmatch_PrepareFinalOut 	( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtkQbf, int ILP_Constraint )
{
	vector< Abc_Obj_t * > XorOuts;
	Abc_Obj_t * pObj, * pObjTmp;
	char * pName;
	int i;

	Abc_NtkForEachPo( pNtk1, pObj, i ) {
cout << "Print Xor : " << endl;
		Abc_AigPrintNode(pObj->pCopy);
		Abc_AigPrintNode(Abc_ObjChild0Copy(pObj));
cout << "END." << endl;
		pObjTmp = Abc_AigXor( (Abc_Aig_t *)pNtkQbf->pManFunc, pObj->pCopy, Abc_ObjChild0Copy(pObj) );
		XorOuts.push_back( pObjTmp );
	}

	pObjTmp = XorOuts[0];
	for( int i = 1, n = XorOuts.size(); i < n; ++i ) {
		pObjTmp = Abc_AigOr( (Abc_Aig_t *)pNtkQbf->pManFunc, pObjTmp, XorOuts[i] );
	}

	pObj = Abc_NtkCreatePo( pNtkQbf );
	pName = "MainOut";
	Abc_ObjAssignName( pObj, pName, NULL );
	Abc_ObjAddFanin( pObj, Abc_ObjNot( pObjTmp ) );

	Abc_AigCleanup( (Abc_Aig_t *)pNtkQbf->pManFunc );
}